

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::
swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::long_string_storage>
          (basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>> *this,
          short_string_storage *param_2)

{
  basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>> bVar1;
  undefined8 uVar2;
  
  bVar1 = (basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>)param_2->tag_;
  uVar2 = *(undefined8 *)(param_2->data_ + 1);
  basic_json<wchar_t,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
  short_string_storage::short_string_storage(param_2,(short_string_storage *)this);
  *this = (basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>)0xf;
  this[1] = bVar1;
  *(undefined8 *)(this + 8) = uVar2;
  return;
}

Assistant:

void swap_l_r(identity<TypeL>,identity<TypeR>,basic_json& other) noexcept
        {
            TypeR temp{other.cast<TypeR>()};
            other.construct<TypeL>(cast<TypeL>());
            construct<TypeR>(temp);
        }